

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O0

void __thiscall crn::corpus_tester::corpus_tester(corpus_tester *this)

{
  color_quad<unsigned_char,_int> local_14;
  corpus_tester *local_10;
  corpus_tester *this_local;
  
  local_10 = this;
  crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image(&this->m_bad_block_img);
  crnlib::color_quad<unsigned_char,_int>::make_black();
  crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::resize
            (&this->m_bad_block_img,0x100,0x100,0xffffffff,&local_14);
  this->m_next_bad_block_index = 0;
  this->m_total_bad_block_files = 0;
  return;
}

Assistant:

corpus_tester::corpus_tester()
    {
        m_bad_block_img.resize(256, 256);
        m_next_bad_block_index = 0;
        m_total_bad_block_files = 0;
    }